

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ConfigUseClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConfigUseClauseSyntax,slang::parsing::Token,slang::syntax::ConfigCellIdentifierSyntax*,slang::syntax::ParameterValueAssignmentSyntax*,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,Token *args,ConfigCellIdentifierSyntax **args_1,
          ParameterValueAssignmentSyntax **args_2,Token *args_3,Token *args_4)

{
  ConfigCellIdentifierSyntax *pCVar1;
  ParameterValueAssignmentSyntax *pPVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  TokenKind TVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  ConfigUseClauseSyntax *pCVar18;
  
  pCVar18 = (ConfigUseClauseSyntax *)allocate(this,0x58,8);
  TVar6 = args->kind;
  uVar7 = args->field_0x2;
  NVar8.raw = (args->numFlags).raw;
  uVar9 = args->rawLen;
  pIVar3 = args->info;
  pCVar1 = *args_1;
  pPVar2 = *args_2;
  TVar10 = args_3->kind;
  uVar11 = args_3->field_0x2;
  NVar12.raw = (args_3->numFlags).raw;
  uVar13 = args_3->rawLen;
  pIVar4 = args_3->info;
  TVar14 = args_4->kind;
  uVar15 = args_4->field_0x2;
  NVar16.raw = (args_4->numFlags).raw;
  uVar17 = args_4->rawLen;
  pIVar5 = args_4->info;
  (pCVar18->super_ConfigRuleClauseSyntax).super_SyntaxNode.kind = ConfigUseClause;
  (pCVar18->super_ConfigRuleClauseSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pCVar18->super_ConfigRuleClauseSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pCVar18->use).kind = TVar6;
  (pCVar18->use).field_0x2 = uVar7;
  (pCVar18->use).numFlags = (NumericTokenFlags)NVar8.raw;
  (pCVar18->use).rawLen = uVar9;
  (pCVar18->use).info = pIVar3;
  pCVar18->name = pCVar1;
  pCVar18->paramAssignments = pPVar2;
  (pCVar18->colon).kind = TVar10;
  (pCVar18->colon).field_0x2 = uVar11;
  (pCVar18->colon).numFlags = (NumericTokenFlags)NVar12.raw;
  (pCVar18->colon).rawLen = uVar13;
  (pCVar18->colon).info = pIVar4;
  (pCVar18->config).kind = TVar14;
  (pCVar18->config).field_0x2 = uVar15;
  (pCVar18->config).numFlags = (NumericTokenFlags)NVar16.raw;
  (pCVar18->config).rawLen = uVar17;
  (pCVar18->config).info = pIVar5;
  if (pCVar1 != (ConfigCellIdentifierSyntax *)0x0) {
    (pCVar1->super_SyntaxNode).parent = (SyntaxNode *)pCVar18;
  }
  if (pPVar2 != (ParameterValueAssignmentSyntax *)0x0) {
    (pPVar2->super_SyntaxNode).parent = (SyntaxNode *)pCVar18;
  }
  return pCVar18;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }